

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
                 *handler)

{
  char cVar1;
  basic_string_view<char> id;
  bool bVar2;
  type count;
  width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *it;
  int index;
  char c;
  char *in_stack_ffffffffffffffa8;
  width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
  *in_stack_ffffffffffffffb0;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar3;
  char **in_stack_ffffffffffffffc0;
  char *local_30;
  char *local_10;
  char *local_8;
  
  cVar1 = *in_RDI;
  local_8 = in_RDI;
  if ((cVar1 == '}') || (cVar1 == ':')) {
    width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
    ::operator()(in_stack_ffffffffffffffb0);
  }
  else if ((cVar1 < '0') || ('9' < cVar1)) {
    bVar2 = is_name_start<char>(cVar1);
    local_30 = in_RDI;
    if (bVar2) {
      do {
        local_30 = local_30 + 1;
        uVar3 = false;
        if (local_30 != in_RSI) {
          cVar1 = *local_30;
          bVar2 = is_name_start<char>(cVar1);
          in_stack_ffffffffffffffbe = true;
          uVar3 = true;
          if (!bVar2) {
            in_stack_ffffffffffffffbd = '/' < cVar1 && cVar1 < ':';
            in_stack_ffffffffffffffbe = in_stack_ffffffffffffffbd;
            uVar3 = in_stack_ffffffffffffffbd;
          }
        }
      } while ((bool)uVar3 != false);
      count = to_unsigned<long>((long)local_30 - (long)in_RDI);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)&stack0xffffffffffffffc0,in_RDI,count);
      id.data_._5_1_ = in_stack_ffffffffffffffbd;
      id.data_._0_5_ = in_stack_ffffffffffffffb8;
      id.data_._6_1_ = in_stack_ffffffffffffffbe;
      id.data_._7_1_ = uVar3;
      id.size_ = (size_t)in_stack_ffffffffffffffc0;
      width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
      ::operator()(in_RDX,id);
      local_8 = local_30;
    }
    else {
      width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  else {
    if (cVar1 == '0') {
      local_10 = in_RDI + 1;
    }
    else {
      parse_nonnegative_int<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>&>
                (in_stack_ffffffffffffffc0,
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,
                                  CONCAT16(in_stack_ffffffffffffffbe,
                                           CONCAT15(in_stack_ffffffffffffffbd,
                                                    in_stack_ffffffffffffffb8))),
                 in_stack_ffffffffffffffb0);
      local_10 = in_RDI;
    }
    if ((local_10 == in_RSI) || ((*local_10 != '}' && (*local_10 != ':')))) {
      width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
      ::operator()(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}